

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O3

void __thiscall
gdscpp::setSTR(gdscpp *this,vector<gdsSTR,_std::allocator<gdsSTR>_> *target_structure)

{
  vector<gdsSTR,_std::allocator<gdsSTR>_> local_28;
  
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::vector(&local_28,target_structure);
  std::vector<gdsSTR,std::allocator<gdsSTR>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<gdsSTR*,std::vector<gdsSTR,std::allocator<gdsSTR>>>>
            ((vector<gdsSTR,std::allocator<gdsSTR>> *)&this->STR,
             (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_28.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_28.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::~vector(&local_28);
  return;
}

Assistant:

void gdscpp::setSTR(vector<gdsSTR> target_structure)
{
  this->push_back_STR(target_structure);
}